

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.c
# Opt level: O1

int optimizeBlock(void)

{
  int iVar1;
  long lVar2;
  
  if (*p == '[') {
    p = p + 1;
    skipSpaces();
    if (*p == ']') {
      lVar2 = (long)byteTop;
      byteTop = byteTop + 1;
      byteBuffer[lVar2] = 'P';
      if (0x7fe < lVar2) {
        error_impl("genByte",0x354,"too many bytecodes");
      }
LAB_00106830:
      p = p + 1;
      skipSpaces();
      return 1;
    }
    iVar1 = parseStatement();
    while (iVar1 != 0) {
      if (*p == '.') {
        p = p + 1;
        skipSpaces();
      }
      if (*p == ']') goto LAB_00106830;
      lVar2 = (long)byteTop;
      byteTop = byteTop + 1;
      byteBuffer[lVar2] = 0xf5;
      if (0x7fe < lVar2) {
        error_impl("genByte",0x354,"too many bytecodes");
      }
      iVar1 = parseStatement();
    }
  }
  else {
    iVar1 = parseTerm();
    if (iVar1 != 0) {
      parseError("missing block as optimized block argument");
    }
  }
  return 0;
}

Assistant:

int optimizeBlock(void)
{
    if (*p != '[') {
        if (!parseTerm())
            return 0;
        parseError("missing block as optimized block argument");
    } else {
        p++;
        skipSpaces();
        if (*p == ']') {
            genInstruction(PushConstant, 0);
            p++;
            skipSpaces();
            return 1;
        }
        while (1) {
            if (!parseStatement())
                return 0;
            if (*p == '.')
                p++, skipSpaces();
            if (*p == ']')
                break;
            genInstruction(DoSpecial, PopTop);
        }
        p++;
        skipSpaces();
        /* just leave last expression on stack */
    }
    return 1;
}